

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationDataBuilder::copyFromBaseCE32
          (CollationDataBuilder *this,UChar32 c,uint32_t ce32,UBool withContext,
          UErrorCode *errorCode)

{
  UChar UVar1;
  CollationData *pCVar2;
  UChar *pUVar3;
  UVector *this_00;
  undefined4 uVar4;
  UBool UVar5;
  char16_t srcChar;
  int32_t iVar6;
  uint32_t uVar7;
  int64_t ce;
  ConditionalCE32 *pCVar8;
  ulong uVar9;
  bool bVar10;
  ConstChar16Ptr local_168;
  UVector *local_160;
  UChar *local_158;
  UChar *local_150;
  UnicodeString local_140;
  ConditionalCE32 local_100;
  undefined1 local_a8 [40];
  UnicodeString local_80;
  uint local_3c;
  
  pCVar2 = this->base;
LAB_0022a879:
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  bVar10 = withContext == '\0';
  do {
    if ((~ce32 & 0xc0) != 0) {
      return ce32;
    }
    switch(ce32 & 0xf) {
    case 5:
      uVar7 = encodeExpansion32(this,(int32_t *)
                                     ((ulong)(ce32 >> 0xb & 0xfffffffc) + (long)pCVar2->ce32s),
                                ce32 >> 8 & 0x1f,errorCode);
      return uVar7;
    case 6:
      uVar7 = encodeExpansion(this,(int64_t *)((ulong)(ce32 >> 10 & 0xfffffff8) + (long)pCVar2->ces)
                              ,ce32 >> 8 & 0x1f,errorCode);
      return uVar7;
    default:
      return ce32;
    case 8:
      goto switchD_0022a8b3_caseD_8;
    case 9:
      if (!bVar10) {
        pCVar8 = (ConditionalCE32 *)local_a8;
        local_a8._8_8_ = &PTR__UnicodeString_003a7268;
        local_a8._16_2_ = 2;
        local_80.fUnion._24_4_ = 0;
        local_80.fUnion._28_4_ = 1;
        local_80.fUnion._32_4_ = 1;
        local_80.fUnion._36_4_ = -1;
        UnicodeString::UnicodeString((UnicodeString *)&local_100,L'\0');
        copyContractionsFromBaseCE32
                  (this,(UnicodeString *)&local_100,c,ce32,(ConditionalCE32 *)local_a8,errorCode);
        uVar4 = local_80.fUnion._36_4_;
        UnicodeSet::add(&this->contextChars,c);
        uVar7 = uVar4 << 0xd | 199;
        UnicodeString::~UnicodeString((UnicodeString *)&local_100);
        goto LAB_0022aab0;
      }
      ce32 = CONCAT22(pCVar2->contexts[ce32 >> 0xd],pCVar2->contexts[(ulong)(ce32 >> 0xd) + 1]);
      bVar10 = true;
      break;
    case 0xc:
      *errorCode = U_UNSUPPORTED_ERROR;
      return ce32;
    case 0xe:
      uVar7 = getCE32FromOffsetCE32(this,'\x01',c,ce32);
      return uVar7;
    case 0xf:
      ce = Collation::unassignedCEFromCodePoint(c);
      uVar7 = encodeOneCE(this,ce,errorCode);
      return uVar7;
    }
  } while( true );
switchD_0022a8b3_caseD_8:
  pUVar3 = pCVar2->contexts;
  uVar9 = (ulong)(ce32 >> 0xd);
  UVar1 = pUVar3[uVar9 + 1];
  ce32 = CONCAT22(pUVar3[uVar9],UVar1);
  withContext = '\0';
  if (!bVar10) goto code_r0x0022a906;
  goto LAB_0022a879;
code_r0x0022a906:
  local_100.context.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003a7268;
  local_100.context.fUnion.fStackFields.fLengthAndFlags = 2;
  local_100.ce32 = 0;
  local_100.defaultCE32 = 1;
  local_100.builtCE32 = 1;
  local_100.next = -1;
  local_158 = pUVar3;
  UnicodeString::UnicodeString(&local_140,L'\0');
  if ((UVar1 & 0xcfU) == 0xc9) {
    iVar6 = copyContractionsFromBaseCE32(this,&local_140,c,ce32,&local_100,errorCode);
  }
  else {
    uVar7 = copyFromBaseCE32(this,c,ce32,'\x01',errorCode);
    iVar6 = addConditionalCE32(this,&local_140,uVar7,errorCode);
    local_100.next = iVar6;
  }
  uVar7 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_160 = &this->conditionalCE32s;
    pCVar8 = (ConditionalCE32 *)UVector::elementAt(local_160,iVar6);
    local_168.p_ = local_158 + uVar9 + 2;
    UCharsTrie::Iterator::Iterator((Iterator *)local_a8,&local_168,0,errorCode);
    this_00 = local_160;
    local_150 = local_168.p_;
    while (UVar5 = UCharsTrie::Iterator::next((Iterator *)local_a8,errorCode), UVar5 != '\0') {
      UnicodeString::operator=(&local_140,&local_80);
      UnicodeString::reverse(&local_140);
      if ((short)local_140.fUnion._0_2_ < 0) {
        srcChar = (char16_t)local_140.fUnion.fFields.fLength;
      }
      else {
        srcChar = local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::insert(&local_140,0,srcChar);
      if ((local_3c & 0xcf) == 0xc9) {
        iVar6 = copyContractionsFromBaseCE32(this,&local_140,c,local_3c,pCVar8,errorCode);
      }
      else {
        uVar7 = copyFromBaseCE32(this,c,local_3c,'\x01',errorCode);
        iVar6 = addConditionalCE32(this,&local_140,uVar7,errorCode);
        pCVar8->next = iVar6;
      }
      if (U_ZERO_ERROR < *errorCode) {
        uVar7 = 0;
        goto LAB_0022ac35;
      }
      pCVar8 = (ConditionalCE32 *)UVector::elementAt(this_00,iVar6);
    }
    iVar6 = local_100.next;
    UnicodeSet::add(&this->contextChars,c);
    uVar7 = iVar6 << 0xd | 199;
LAB_0022ac35:
    UCharsTrie::Iterator::~Iterator((Iterator *)local_a8);
  }
  UnicodeString::~UnicodeString(&local_140);
  pCVar8 = &local_100;
LAB_0022aab0:
  UnicodeString::~UnicodeString(&pCVar8->context);
  return uVar7;
}

Assistant:

uint32_t
CollationDataBuilder::copyFromBaseCE32(UChar32 c, uint32_t ce32, UBool withContext,
                                       UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(!Collation::isSpecialCE32(ce32)) { return ce32; }
    switch(Collation::tagFromCE32(ce32)) {
    case Collation::LONG_PRIMARY_TAG:
    case Collation::LONG_SECONDARY_TAG:
    case Collation::LATIN_EXPANSION_TAG:
        // copy as is
        break;
    case Collation::EXPANSION32_TAG: {
        const uint32_t *baseCE32s = base->ce32s + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);
        ce32 = encodeExpansion32(
            reinterpret_cast<const int32_t *>(baseCE32s), length, errorCode);
        break;
    }
    case Collation::EXPANSION_TAG: {
        const int64_t *baseCEs = base->ces + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);
        ce32 = encodeExpansion(baseCEs, length, errorCode);
        break;
    }
    case Collation::PREFIX_TAG: {
        // Flatten prefixes and nested suffixes (contractions)
        // into a linear list of ConditionalCE32.
        const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
        ce32 = CollationData::readCE32(p);  // Default if no prefix match.
        if(!withContext) {
            return copyFromBaseCE32(c, ce32, FALSE, errorCode);
        }
        ConditionalCE32 head;
        UnicodeString context((UChar)0);
        int32_t index;
        if(Collation::isContractionCE32(ce32)) {
            index = copyContractionsFromBaseCE32(context, c, ce32, &head, errorCode);
        } else {
            ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
            head.next = index = addConditionalCE32(context, ce32, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        ConditionalCE32 *cond = getConditionalCE32(index);  // the last ConditionalCE32 so far
        UCharsTrie::Iterator prefixes(p + 2, 0, errorCode);
        while(prefixes.next(errorCode)) {
            context = prefixes.getString();
            context.reverse();
            context.insert(0, (UChar)context.length());
            ce32 = (uint32_t)prefixes.getValue();
            if(Collation::isContractionCE32(ce32)) {
                index = copyContractionsFromBaseCE32(context, c, ce32, cond, errorCode);
            } else {
                ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
                cond->next = index = addConditionalCE32(context, ce32, errorCode);
            }
            if(U_FAILURE(errorCode)) { return 0; }
            cond = getConditionalCE32(index);
        }
        ce32 = makeBuilderContextCE32(head.next);
        contextChars.add(c);
        break;
    }
    case Collation::CONTRACTION_TAG: {
        if(!withContext) {
            const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
            ce32 = CollationData::readCE32(p);  // Default if no suffix match.
            return copyFromBaseCE32(c, ce32, FALSE, errorCode);
        }
        ConditionalCE32 head;
        UnicodeString context((UChar)0);
        copyContractionsFromBaseCE32(context, c, ce32, &head, errorCode);
        ce32 = makeBuilderContextCE32(head.next);
        contextChars.add(c);
        break;
    }
    case Collation::HANGUL_TAG:
        errorCode = U_UNSUPPORTED_ERROR;  // We forbid tailoring of Hangul syllables.
        break;
    case Collation::OFFSET_TAG:
        ce32 = getCE32FromOffsetCE32(TRUE, c, ce32);
        break;
    case Collation::IMPLICIT_TAG:
        ce32 = encodeOneCE(Collation::unassignedCEFromCodePoint(c), errorCode);
        break;
    default:
        U_ASSERT(FALSE);  // require ce32 == base->getFinalCE32(ce32)
        break;
    }
    return ce32;
}